

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::Clipper::DoMaxima(Clipper *this,TEdge *e,long64 topY)

{
  TEdge *e2;
  long64 e2_00;
  long64 e1;
  clipperException *pcVar1;
  IntPoint local_68;
  IntPoint local_58 [2];
  TEdge *local_38;
  TEdge *eNext;
  long64 X;
  TEdge *eMaxPair;
  long64 topY_local;
  TEdge *e_local;
  Clipper *this_local;
  
  eMaxPair = (TEdge *)topY;
  topY_local = (long64)e;
  e_local = (TEdge *)this;
  X = (long64)GetMaximaPair(e);
  eNext = *(TEdge **)(topY_local + 0x20);
  for (local_38 = *(TEdge **)(topY_local + 0x70); e1 = topY_local, e2_00 = X, e2 = local_38,
      local_38 != (TEdge *)X; local_38 = local_38->nextInAEL) {
    if (local_38 == (TEdge *)0x0) {
      pcVar1 = (clipperException *)__cxa_allocate_exception(0x28);
      clipperException::clipperException(pcVar1,"DoMaxima error");
      __cxa_throw(pcVar1,&clipperException::typeinfo,clipperException::~clipperException);
    }
    IntPoint::IntPoint(local_58,(long64)eNext,(long64)eMaxPair);
    IntersectEdges(this,(TEdge *)e1,e2,local_58,ipBoth);
  }
  if ((*(int *)(topY_local + 0x54) < 0) && (*(int *)(X + 0x54) < 0)) {
    DeleteFromAEL(this,(TEdge *)topY_local);
    DeleteFromAEL(this,(TEdge *)X);
  }
  else {
    if ((*(int *)(topY_local + 0x54) < 0) || (*(int *)(X + 0x54) < 0)) {
      pcVar1 = (clipperException *)__cxa_allocate_exception(0x28);
      clipperException::clipperException(pcVar1,"DoMaxima error");
      __cxa_throw(pcVar1,&clipperException::typeinfo,clipperException::~clipperException);
    }
    IntPoint::IntPoint(&local_68,(long64)eNext,(long64)eMaxPair);
    IntersectEdges(this,(TEdge *)e1,(TEdge *)e2_00,&local_68,ipNone);
  }
  return;
}

Assistant:

void Clipper::DoMaxima(TEdge *e, long64 topY)
{
  TEdge* eMaxPair = GetMaximaPair(e);
  long64 X = e->xtop;
  TEdge* eNext = e->nextInAEL;
  while( eNext != eMaxPair )
  {
    if (!eNext) throw clipperException("DoMaxima error");
    IntersectEdges( e, eNext, IntPoint(X, topY), ipBoth );
    eNext = eNext->nextInAEL;
  }
  if( e->outIdx < 0 && eMaxPair->outIdx < 0 )
  {
    DeleteFromAEL( e );
    DeleteFromAEL( eMaxPair );
  }
  else if( e->outIdx >= 0 && eMaxPair->outIdx >= 0 )
  {
    IntersectEdges( e, eMaxPair, IntPoint(X, topY), ipNone );
  }
  else throw clipperException("DoMaxima error");
}